

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jason.c
# Opt level: O2

void FinishLoop(void)

{
  int iVar1;
  addressrec a;
  addressrec a_00;
  
  iVar1 = actionpop();
  a = setaddress(opnaddr,iVar1);
  iVar1 = actionpop();
  a_00 = setaddress(opnaddr,iVar1);
  genquad(opjump,a_00,(addressrec)0x4,(addressrec)0x4);
  nextop = genquad(oplabel,a,(addressrec)0x4,(addressrec)0x4);
  setivalue(a.opnd,nextop);
  return;
}

Assistant:

void	FinishLoop(void)
{
    struct addressrec	addr1, addr2;
    
    addr2 = setaddress(opnaddr, actionpop());
    addr1 = setaddress(opnaddr, actionpop());
    
    genquad(opjump, addr1, no_op, no_op);
    nextop = genquad(oplabel, addr2, no_op, no_op);
    setivalue(addr2.opnd, nextop);
    
}